

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void test_intersects(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  bitset_t *b2;
  int i;
  bitset_t *odds;
  bitset_t *evens;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  bitset = bitset_create();
  b2 = bitset_create();
  _Var1 = bitset_empty(bitset);
  if (!_Var1) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_intersects",0xbe);
    exit(1);
  }
  for (iVar2 = 0; iVar2 < 1000; iVar2 = iVar2 + 1) {
    if (iVar2 % 2 == 0) {
      bitset_set(b2,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    }
    else {
      bitset_set(b2,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    }
  }
  _Var1 = bitsets_intersect(bitset,b2);
  if (!_Var1) {
    bitset_set(b2,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    bitset_set(b2,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    _Var1 = bitsets_intersect(bitset,b2);
    if (!_Var1) {
      fprintf(_stderr,"Assertion failed in %s at line %d\n","test_intersects",0xcc);
      exit(1);
    }
    bitset_free((bitset_t *)0x1020fa);
    bitset_free((bitset_t *)0x102104);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_intersects",199);
  exit(1);
}

Assistant:

void test_intersects() {
  bitset_t *evens = bitset_create();
  bitset_t *odds = bitset_create();
  TEST_ASSERT(bitset_empty(evens));

  for (int i = 0; i < 1000; i++) {
    if (i % 2 == 0)
      bitset_set(evens, i);
    else
      bitset_set(odds, i);
  }

  TEST_ASSERT(!bitsets_intersect(evens, odds));

  bitset_set(evens, 1001);
  bitset_set(odds, 1001);

  TEST_ASSERT(bitsets_intersect(evens, odds));

  bitset_free(evens);
  bitset_free(odds);
}